

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_signed_data_unittest.cc
# Opt level: O0

void bssl::anon_unknown_0::RunTestCase
               (VerifyResult expected_result,char *file_name,SignatureVerifyCache *cache)

{
  SignatureAlgorithm algorithm_00;
  bool bVar1;
  char *pcVar2;
  Message *message;
  SignatureAlgorithm *pSVar3;
  BitString *signature_value_00;
  char *in_R9;
  undefined1 auVar4 [16];
  Span<const_unsigned_char> SVar5;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  AssertHelper local_350;
  Message local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar;
  Span<const_unsigned_char> local_310;
  undefined1 local_300 [16];
  Span<const_unsigned_char> local_2f0;
  Span<const_unsigned_char> local_2e0;
  bool local_2ca;
  bool local_2c9;
  undefined1 local_2c8 [6];
  bool result;
  bool expected_result_bool;
  AssertHelper local_2a8;
  Message local_2a0;
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar__2;
  optional<bssl::der::BitString> signature_value_bit_string;
  Span<const_unsigned_char> local_240;
  undefined1 local_230 [8];
  Parser signature_value_parser;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__1;
  Span<const_unsigned_char> local_1b8;
  _Optional_payload_base<bssl::SignatureAlgorithm> local_1a4;
  optional<bssl::SignatureAlgorithm> signature_algorithm;
  AssertHelper local_178;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_;
  PemBlockMapping mappings [4];
  string signature_value;
  string signed_data;
  string algorithm;
  string public_key;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string path;
  SignatureVerifyCache *cache_local;
  char *file_name_local;
  VerifyResult expected_result_local;
  
  path.field_2._8_8_ = cache;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"testdata/verify_signed_data_unittest/",&local_61);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,file_name);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::allocator<char>::~allocator(&local_61);
  ::std::__cxx11::string::string((string *)(algorithm.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)(signed_data.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)(signature_value.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)&mappings[3].optional);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )anon_var_dwarf_25fe16;
  mappings[0].value._0_1_ = 0;
  mappings[0]._16_8_ = (long)"SIGNATURE ALGORITHM" + 10;
  mappings[1].value._0_1_ = 0;
  mappings[1]._16_8_ = anon_var_dwarf_356490;
  mappings[2].value._0_1_ = 0;
  mappings[2]._16_8_ = (long)"VerifyError::StatusCode::CERTIFICATE_INVALID_SIGNATURE" + 0x2d;
  mappings[3].value._0_1_ = 0;
  mappings[0].block_name = algorithm.field_2._M_local_buf + 8;
  mappings[1].block_name = signed_data.field_2._M_local_buf + 8;
  mappings[2].block_name = signature_value.field_2._M_local_buf + 8;
  mappings[3].block_name = &mappings[3].optional;
  ReadTestDataFromPemFile<4ul>
            ((bssl *)local_168,(string *)local_40,(PemBlockMapping (*) [4])&gtest_ar_.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
                _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm>._M_engaged,
               (internal *)local_168,(AssertionResult *)"ReadTestDataFromPemFile(path, mappings)",
               "false","true",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_signed_data_unittest.cc"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    ::std::__cxx11::string::~string
              ((string *)
               &signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
                _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm>._M_engaged);
    testing::Message::~Message(&local_170);
  }
  signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
  super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value._1_3_ = 0;
  signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
  super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value._0_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  if (signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value == kRsaPkcs1Sha1) {
    auVar4 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)(signed_data.field_2._M_local_buf + 8));
    s._M_str = auVar4._8_8_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = auVar4._0_8_;
    s._M_len = (size_t)s._M_str;
    SVar5 = StringAsBytes((bssl *)gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl,s);
    bssl::der::Input::Input((Input *)&local_1b8,SVar5);
    local_1a4 = (_Optional_payload_base<bssl::SignatureAlgorithm>)
                ParseSignatureAlgorithm((Input)local_1b8);
    testing::AssertionResult::AssertionResult<std::optional<bssl::SignatureAlgorithm>>
              ((AssertionResult *)local_1e8,(optional<bssl::SignatureAlgorithm> *)&local_1a4,
               (type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&signature_value_parser.advance_len_,(internal *)local_1e8,
                 (AssertionResult *)"signature_algorithm","false","true",in_R9);
      pcVar2 = (char *)::std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_signed_data_unittest.cc"
                 ,0x47,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      ::std::__cxx11::string::~string((string *)&signature_value_parser.advance_len_);
      testing::Message::~Message(&local_1f0);
    }
    signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
    super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value._1_3_ = 0;
    signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
    super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value._0_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
    if (signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
        super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value == kRsaPkcs1Sha1)
    {
      auVar4 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)&mappings[3].optional);
      s_00._M_str = auVar4._8_8_;
      s_00._M_len = (size_t)s_00._M_str;
      SVar5 = StringAsBytes(auVar4._0_8_,s_00);
      bssl::der::Input::Input((Input *)&local_240,SVar5);
      bssl::der::Parser::Parser((Parser *)local_230,(Input)local_240);
      bssl::der::Parser::ReadBitString
                ((optional<bssl::der::BitString> *)&gtest_ar__2.message_,(Parser *)local_230);
      local_291 = ::std::optional<bssl::der::BitString>::has_value
                            ((optional<bssl::der::BitString> *)&gtest_ar__2.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_290,&local_291,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
      if (!bVar1) {
        testing::Message::Message(&local_2a0);
        message = testing::Message::operator<<
                            (&local_2a0,
                             (char (*) [46])"The signature value is not a valid BIT STRING");
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_2c8,(internal *)local_290,
                   (AssertionResult *)"signature_value_bit_string.has_value()","false","true",in_R9)
        ;
        pcVar2 = (char *)::std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_2a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_signed_data_unittest.cc"
                   ,0x4c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_2a8,message);
        testing::internal::AssertHelper::~AssertHelper(&local_2a8);
        ::std::__cxx11::string::~string((string *)local_2c8);
        testing::Message::~Message(&local_2a0);
      }
      signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value._1_3_ = 0;
      signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value._0_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
      if (signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
          super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value ==
          kRsaPkcs1Sha1) {
        local_2c9 = expected_result == SUCCESS;
        pSVar3 = ::std::optional<bssl::SignatureAlgorithm>::operator*
                           ((optional<bssl::SignatureAlgorithm> *)&local_1a4);
        algorithm_00 = *pSVar3;
        local_300 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)(signature_value.field_2._M_local_buf + 8));
        s_01._M_str = local_300._8_8_;
        s_01._M_len = (size_t)s_01._M_str;
        local_2f0 = StringAsBytes(local_300._0_8_,s_01);
        bssl::der::Input::Input((Input *)&local_2e0,local_2f0);
        signature_value_00 =
             ::std::optional<bssl::der::BitString>::value
                       ((optional<bssl::der::BitString> *)&gtest_ar__2.message_);
        auVar4 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)(algorithm.field_2._M_local_buf + 8));
        s_02._M_str = auVar4._8_8_;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl = auVar4._0_8_;
        s_02._M_len = (size_t)s_02._M_str;
        SVar5 = StringAsBytes((bssl *)gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl,s_02);
        bssl::der::Input::Input((Input *)&local_310,SVar5);
        local_2ca = VerifySignedData(algorithm_00,(Input)local_2e0,signature_value_00,
                                     (Input)local_310,(SignatureVerifyCache *)path.field_2._8_8_);
        testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                  ((EqHelper *)local_340,"expected_result_bool","result",&local_2c9,&local_2ca);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
        if (!bVar1) {
          testing::Message::Message(&local_348);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
          testing::internal::AssertHelper::AssertHelper
                    (&local_350,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_signed_data_unittest.cc"
                     ,0x55,pcVar2);
          testing::internal::AssertHelper::operator=(&local_350,&local_348);
          testing::internal::AssertHelper::~AssertHelper(&local_350);
          testing::Message::~Message(&local_348);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
        signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
        super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value = kRsaPkcs1Sha1;
      }
    }
  }
  ::std::__cxx11::string::~string((string *)&mappings[3].optional);
  ::std::__cxx11::string::~string((string *)(signature_value.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(signed_data.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(algorithm.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void RunTestCase(VerifyResult expected_result, const char *file_name,
                 SignatureVerifyCache *cache) {
  std::string path =
      std::string("testdata/verify_signed_data_unittest/") + file_name;

  std::string public_key;
  std::string algorithm;
  std::string signed_data;
  std::string signature_value;

  const PemBlockMapping mappings[] = {
      {"PUBLIC KEY", &public_key},
      {"ALGORITHM", &algorithm},
      {"DATA", &signed_data},
      {"SIGNATURE", &signature_value},
  };

  ASSERT_TRUE(ReadTestDataFromPemFile(path, mappings));

  std::optional<SignatureAlgorithm> signature_algorithm =
      ParseSignatureAlgorithm(StringAsBytes(algorithm));
  ASSERT_TRUE(signature_algorithm);

  der::Parser signature_value_parser(StringAsBytes(signature_value));
  std::optional<der::BitString> signature_value_bit_string =
      signature_value_parser.ReadBitString();
  ASSERT_TRUE(signature_value_bit_string.has_value())
      << "The signature value is not a valid BIT STRING";

  bool expected_result_bool = expected_result == SUCCESS;

  bool result = VerifySignedData(
      *signature_algorithm, StringAsBytes(signed_data),
      signature_value_bit_string.value(), StringAsBytes(public_key), cache);

  EXPECT_EQ(expected_result_bool, result);
}